

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsException.h
# Opt level: O1

void __thiscall AdsException::~AdsException(AdsException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__AdsException_00105d78;
  pcVar1 = (this->m_Message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Message).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~AdsException() throw (){}